

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O3

void sptk::world::anon_unknown_5::GetMultiChannelF0
               (double *f0,int f0_length,int *boundary_list,int number_of_boundaries,
               double **multi_channel_f0)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (1 < number_of_boundaries) {
    uVar5 = 0;
    do {
      iVar2 = boundary_list[uVar5 * 2];
      lVar7 = (long)iVar2;
      if (0 < lVar7) {
        memset(multi_channel_f0[uVar5],0,lVar7 * 8);
      }
      iVar3 = boundary_list[uVar5 * 2 + 1];
      iVar1 = iVar3 + 1;
      if (iVar2 <= iVar3) {
        pdVar4 = multi_channel_f0[uVar5];
        lVar6 = 0;
        do {
          pdVar4[lVar7 + lVar6] = f0[lVar7 + lVar6];
          lVar6 = lVar6 + 1;
        } while (iVar1 - iVar2 != (int)lVar6);
      }
      if (iVar1 < f0_length) {
        memset(multi_channel_f0[uVar5] + iVar1,0,(ulong)(uint)((f0_length + -2) - iVar3) * 8 + 8);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)number_of_boundaries >> 1);
  }
  return;
}

Assistant:

static void GetMultiChannelF0(const double *f0, int f0_length,
    const int *boundary_list, int number_of_boundaries,
    double **multi_channel_f0) {
  for (int i = 0; i < number_of_boundaries / 2; ++i) {
    for (int j = 0; j < boundary_list[i * 2]; ++j)
      multi_channel_f0[i][j] = 0.0;
    for (int j = boundary_list[i * 2]; j <= boundary_list[i * 2 + 1]; ++j)
      multi_channel_f0[i][j] = f0[j];
    for (int j = boundary_list[i * 2 + 1] + 1; j < f0_length; ++j)
      multi_channel_f0[i][j] = 0.0;
  }
}